

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectsContext.cpp
# Opt level: O1

void __thiscall
ObjectsContext::WriteEncodedHexString
          (ObjectsContext *this,string *inString,ETokenSeparator inSeparate)

{
  bool bVar1;
  ObjectsContext *this_00;
  string local_40;
  
  if (this->mEncryptionHelper != (EncryptionHelper *)0x0) {
    this_00 = (ObjectsContext *)inString;
    bVar1 = EncryptionHelper::IsEncrypting(this->mEncryptionHelper);
    if (bVar1) {
      DecodeHexString(&local_40,this_00,inString);
      WriteHexString(this,&local_40,inSeparate);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
      return;
    }
  }
  PrimitiveObjectsWriter::WriteEncodedHexString(&this->mPrimitiveWriter,inString,inSeparate);
  return;
}

Assistant:

void ObjectsContext::WriteEncodedHexString(const std::string& inString, ETokenSeparator inSeparate) 
{
	if (IsEncrypting())
	{
		WriteHexString(DecodeHexString(inString), inSeparate);
	}
	else {
		mPrimitiveWriter.WriteEncodedHexString(inString, inSeparate);
	}
}